

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O3

int match_pattern(char *tp,char *pp)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  char *psp;
  char *pcVar4;
  char *tsp;
  char *pcVar5;
  
  bVar3 = false;
  pcVar4 = pp;
  pcVar5 = tp;
  do {
    cVar1 = *pcVar4;
    if (cVar1 == '*') {
      while (pp = pcVar4, cVar1 == '*') {
        pcVar4 = pp + 1;
        cVar1 = pp[1];
      }
      if (cVar1 == '\0') {
        return 1;
      }
      tp = pcVar5 + -1;
      do {
        cVar2 = tp[1];
        tp = tp + 1;
        if (cVar2 == cVar1) break;
      } while (cVar2 != '\0');
      bVar3 = true;
      pcVar4 = pp;
      pcVar5 = tp;
      if (cVar2 == '\0') {
        return 0;
      }
    }
    else {
      if (cVar1 == '\0') {
        return (int)(*pcVar5 == '\0');
      }
      if (*pcVar5 != cVar1) {
        if (!bVar3) {
          return 0;
        }
        do {
          pcVar4 = tp + 1;
          if (*pcVar4 == '\0') {
            return 0;
          }
          tp = tp + 1;
        } while (*pcVar4 != *pp);
        bVar3 = true;
        pcVar4 = pp;
        pcVar5 = tp;
      }
    }
    pcVar5 = pcVar5 + 1;
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

int match_pattern(char *tp, char *pp)
{
  char *tsp, *psp;
  int inastr;

#ifdef DOS
  /* % is not allowed in DOS names for Medley. */
  if (strchr(tp, '%')) return 0;

#endif /* DOS */

  for (tsp = tp, psp = pp, inastr = 0;; tp++, pp++) {
    switch (*pp) {
      case '\0': return ((*tp == '\0') ? 1 : 0);

      case '*':
        while (*pp == '*') pp++; /* Skip successive '*'s. */
        if (*pp == '\0') return (1);

        psp = pp;
        while (*tp != *pp && *tp != '\0') tp++;

        if (*tp == '\0') return (0);

        tsp = tp;
        inastr = 1;

        continue;

      default:
        if (*tp == *pp) continue;

        if (inastr) {
          /*
           * Try to find a character which match to
           * a character psp points from a character
           * next to tsp.  If found retry from there.
           */
          for (tp = tsp + 1; *tp != '\0' && *tp != *psp; tp++) {}
          if (*tp == '\0') return (0);
          pp = psp;
          tsp = tp;
          continue;
        } else {
          return (0);
        }
    }
  }
}